

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::MemberInfo::MemberInfo
          (MemberInfo *this,MemberInfo *parent,uint codeOrder,Reader *decl,
          NodeSourceInfoBuilderPair builderPair,bool isInUnion)

{
  NodeSourceInfoBuilderPair NVar1;
  bool bVar2;
  Which WVar3;
  uint32_t uVar4;
  StringPtr local_c8;
  Fault local_b8;
  Fault f;
  undefined1 local_a8 [8];
  DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
  _kjCondition;
  Reader local_70;
  ArrayPtr<const_char> local_40;
  undefined1 local_29;
  Reader *pRStack_28;
  bool isInUnion_local;
  Reader *decl_local;
  MemberInfo *pMStack_18;
  uint codeOrder_local;
  MemberInfo *parent_local;
  MemberInfo *this_local;
  
  NVar1 = builderPair;
  this->parent = parent;
  this->codeOrder = codeOrder;
  this->index = 0;
  this->childCount = 0;
  this->childInitializedCount = 0;
  this->unionDiscriminantCount = 0;
  this->isInUnion = isInUnion;
  local_29 = isInUnion;
  pRStack_28 = decl;
  decl_local._4_4_ = codeOrder;
  pMStack_18 = parent;
  parent_local = this;
  Declaration::Reader::getName(&local_70,decl);
  local_40 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_70);
  (this->name).content.ptr = local_40.ptr;
  (this->name).content.size_ = local_40.size_;
  Declaration::Reader::getId(&this->declId,pRStack_28);
  WVar3 = Declaration::Reader::which(pRStack_28);
  this->declKind = WVar3;
  this->isParam = false;
  this->hasDefaultValue = false;
  Expression::Reader::Reader(&this->fieldType);
  Expression::Reader::Reader(&this->fieldDefaultValue);
  Declaration::Reader::getAnnotations(&this->declAnnotations,pRStack_28);
  uVar4 = Declaration::Reader::getStartByte(pRStack_28);
  this->startByte = uVar4;
  uVar4 = Declaration::Reader::getEndByte(pRStack_28);
  this->endByte = uVar4;
  kj::Maybe<capnp::Text::Reader>::Maybe();
  kj::Maybe<capnp::schema::Field::Builder>::Maybe(&this->schema);
  (this->node)._builder.dataSize = builderPair.node._builder.dataSize;
  (this->node)._builder.pointerCount = builderPair.node._builder.pointerCount;
  *(undefined2 *)&(this->node)._builder.field_0x26 = builderPair.node._builder._38_2_;
  builderPair.node._builder.segment = NVar1.node._builder.segment;
  builderPair.node._builder.capTable = NVar1.node._builder.capTable;
  builderPair.node._builder.data = NVar1.node._builder.data;
  builderPair.node._builder.pointers = NVar1.node._builder.pointers;
  (this->node)._builder.data = builderPair.node._builder.data;
  (this->node)._builder.pointers = builderPair.node._builder.pointers;
  (this->node)._builder.segment = builderPair.node._builder.segment;
  (this->node)._builder.capTable = builderPair.node._builder.capTable;
  builderPair.sourceInfo._builder._32_8_ = NVar1.sourceInfo._builder._32_8_;
  (this->sourceInfo)._builder.dataSize = builderPair.sourceInfo._builder.dataSize;
  (this->sourceInfo)._builder.pointerCount = builderPair.sourceInfo._builder.pointerCount;
  *(undefined2 *)&(this->sourceInfo)._builder.field_0x26 = builderPair.sourceInfo._builder._38_2_;
  builderPair.sourceInfo._builder.segment = NVar1.sourceInfo._builder.segment;
  builderPair.sourceInfo._builder.capTable = NVar1.sourceInfo._builder.capTable;
  builderPair.sourceInfo._builder.data = NVar1.sourceInfo._builder.data;
  builderPair.sourceInfo._builder.pointers = NVar1.sourceInfo._builder.pointers;
  (this->sourceInfo)._builder.data = builderPair.sourceInfo._builder.data;
  (this->sourceInfo)._builder.pointers = builderPair.sourceInfo._builder.pointers;
  (this->sourceInfo)._builder.segment = builderPair.sourceInfo._builder.segment;
  (this->sourceInfo)._builder.capTable = builderPair.sourceInfo._builder.capTable;
  (this->field_21).fieldScope = (StructOrGroup *)0x0;
  f.exception._4_2_ = Declaration::Reader::which(pRStack_28);
  f.exception._6_2_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Which *)((long)&f.exception + 4));
  f.exception._2_2_ = 6;
  kj::_::DebugExpression<capnp::compiler::Declaration::Which>::operator!=
            ((DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
              *)local_a8,
             (DebugExpression<capnp::compiler::Declaration::Which> *)((long)&f.exception + 6),
             (Which *)((long)&f.exception + 2));
  bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a8);
  if (bVar2) {
    bVar2 = Declaration::Reader::hasDocComment(pRStack_28);
    if (bVar2) {
      local_c8.content = (ArrayPtr<const_char>)Declaration::Reader::getDocComment(pRStack_28);
      kj::Maybe<capnp::Text::Reader>::operator=(&this->docComment,(Reader *)&local_c8);
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::compiler::Declaration::Which,capnp::compiler::Declaration::Which>&>
            (&local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x452,FAILED,"decl.which() != Declaration::FIELD","_kjCondition,",
             (DebugComparison<capnp::compiler::Declaration::Which,_capnp::compiler::Declaration::Which>
              *)local_a8);
  kj::_::Debug::Fault::fatal(&local_b8);
}

Assistant:

inline MemberInfo(MemberInfo& parent, uint codeOrder,
                      const Declaration::Reader& decl,
                      NodeSourceInfoBuilderPair builderPair,
                      bool isInUnion)
        : parent(&parent), codeOrder(codeOrder), isInUnion(isInUnion),
          name(decl.getName().getValue()), declId(decl.getId()), declKind(decl.which()),
          declAnnotations(decl.getAnnotations()),
          startByte(decl.getStartByte()), endByte(decl.getEndByte()),
          node(builderPair.node), sourceInfo(builderPair.sourceInfo), unionScope(nullptr) {
      KJ_REQUIRE(decl.which() != Declaration::FIELD);
      if (decl.hasDocComment()) {
        docComment = decl.getDocComment();
      }
    }